

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-sp3.c
# Opt level: O0

int get_line(FILE *f,char *line)

{
  int iVar1;
  char *pcVar2;
  int *piVar3;
  size_t local_28;
  long length;
  char *line_local;
  FILE *f_local;
  
  pcVar2 = fgets(line,1000,(FILE *)f);
  if (pcVar2 == (char *)0x0) {
    iVar1 = ferror((FILE *)f);
    if (iVar1 == 0) {
      *line = '\0';
      f_local._4_4_ = 0;
    }
    else {
      piVar3 = __errno_location();
      pcVar2 = strerror(*piVar3);
      coda_set_error(-0x16,"could not read from file (%s)",pcVar2);
      f_local._4_4_ = -1;
    }
  }
  else {
    local_28 = strlen(line);
    if ((0 < (long)local_28) && (line[local_28 - 1] == '\n')) {
      line[local_28 - 1] = '\0';
      local_28 = local_28 - 1;
    }
    if ((0 < (long)local_28) && (line[local_28 - 1] == '\r')) {
      line[local_28 - 1] = '\0';
      local_28 = local_28 - 1;
    }
    f_local._4_4_ = (int)local_28;
  }
  return f_local._4_4_;
}

Assistant:

static int get_line(FILE *f, char *line)
{
    long length;

    if (fgets(line, MAX_LINE_LENGTH, f) == NULL)
    {
        if (ferror(f))
        {
            coda_set_error(CODA_ERROR_FILE_READ, "could not read from file (%s)", strerror(errno));
            return -1;
        }
        /* end of file -> return empty line  */
        line[0] = '\0';
        return 0;
    }
    length = (long)strlen(line);

    /* remove 'linefeed' character if available */
    if (length > 0 && line[length - 1] == '\n')
    {
        line[length - 1] = '\0';
        length--;
    }

    /* remove 'carriage return' character if available */
    if (length > 0 && line[length - 1] == '\r')
    {
        line[length - 1] = '\0';
        length--;
    }

    return length;
}